

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataHolder.hpp
# Opt level: O2

void __thiscall
OpenMD::DataHolder::assign<std::vector<double,std::allocator<double>>>
          (DataHolder *this,string *keyword,vector<double,_std::allocator<double>_> *val)

{
  long *plVar1;
  char cVar2;
  iterator iVar3;
  iterator iVar4;
  ostream *poVar5;
  OpenMDException *pOVar6;
  string local_1f0;
  _Vector_base<double,_std::allocator<double>_> local_1d0;
  stringstream ss;
  ostream local_1a8 [376];
  
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::find(&(this->parameters_)._M_t,keyword);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->parameters_)._M_t._M_impl.super__Rb_tree_header) {
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->deprecatedKeywords_)._M_t,keyword);
    if ((_Rb_tree_header *)iVar4._M_node !=
        &(this->deprecatedKeywords_)._M_t._M_impl.super__Rb_tree_header) {
      snprintf(painCave.errMsg,2000,
               "%s keyword has been deprecated in OpenMD. Please update your .omd file.\n",
               (keyword->_M_dataplus)._M_p);
      painCave.isFatal = 0;
      painCave.severity = 2;
      simError();
      return;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar5 = std::operator<<(local_1a8,(string *)keyword);
    std::operator<<(poVar5," is not a recognized keyword.\n");
    pOVar6 = (OpenMDException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    OpenMDException::OpenMDException(pOVar6,&local_1f0);
    __cxa_throw(pOVar6,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
  }
  plVar1 = *(long **)(iVar3._M_node + 2);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_1d0,val);
  cVar2 = (**(code **)(*plVar1 + 0x40))(plVar1,&local_1d0);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_1d0);
  if (cVar2 != '\0') {
    return;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar5 = std::operator<<(local_1a8,"Error in parsing ");
  poVar5 = std::operator<<(poVar5,(string *)keyword);
  poVar5 = std::operator<<(poVar5,": expected ");
  (**(code **)(**(long **)(iVar3._M_node + 2) + 0x48))(&local_1f0);
  poVar5 = std::operator<<(poVar5,(string *)&local_1f0);
  poVar5 = std::operator<<(poVar5," but got ");
  poVar5 = std::ostream::_M_insert<void_const*>(poVar5);
  std::operator<<(poVar5,"\n");
  std::__cxx11::string::~string((string *)&local_1f0);
  pOVar6 = (OpenMDException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  OpenMDException::OpenMDException(pOVar6,&local_1f0);
  __cxa_throw(pOVar6,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

void assign(const std::string& keyword, T val) {
      ParamMap::iterator i = parameters_.find(keyword);
      if (i != parameters_.end()) {
        bool result = i->second->setData(val);
        if (!result) {
          std::stringstream ss;
          ss << "Error in parsing " << keyword << ": expected "
             << i->second->getParamType() << " but got " << &val << "\n";
          throw OpenMDException(ss.str());
        }
      } else if (deprecatedKeywords_.find(keyword) !=
                 deprecatedKeywords_.end()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "%s keyword has been deprecated in OpenMD. Please update your "
                 ".omd file.\n",
                 keyword.c_str());
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_WARNING;
        simError();
      } else {
        std::stringstream ss;
        ss << keyword << " is not a recognized keyword.\n";
        throw OpenMDException(ss.str());
      }
    }